

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O0

int Psr_NtkCountObjects(Psr_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  undefined4 local_20;
  undefined4 local_1c;
  int Count;
  int i;
  Vec_Int_t *vFanins;
  Psr_Ntk_t *pNtk_local;
  
  local_20 = Psr_NtkObjNum(pNtk);
  local_1c = 0;
  while( true ) {
    iVar1 = Psr_NtkBoxNum(pNtk);
    bVar3 = false;
    if (local_1c < iVar1) {
      pVVar2 = Psr_BoxSignals(pNtk,local_1c);
      bVar3 = pVVar2 != (Vec_Int_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Psr_BoxIONum(pNtk,local_1c);
    local_20 = iVar1 + local_20;
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Psr_NtkCountObjects( Psr_Ntk_t * pNtk )
{
    Vec_Int_t * vFanins; 
    int i, Count = Psr_NtkObjNum(pNtk);
    Psr_NtkForEachBox( pNtk, vFanins, i )
        Count += Psr_BoxIONum(pNtk, i);
    return Count;
}